

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  pointer pDVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  DataKey *pDVar6;
  char cVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  undefined1 uVar13;
  byte bVar14;
  Result RVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  DuplicateRowsPS *pDVar21;
  SPxOut *pSVar22;
  bool bVar23;
  long lVar24;
  long lVar25;
  pointer pDVar26;
  Item *pIVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  undefined4 *puVar32;
  cpp_dec_float<200u,int,void> *pcVar33;
  Verbosity *pVVar34;
  pointer pnVar35;
  cpp_dec_float<200U,_int,_void> *pcVar36;
  uint *puVar37;
  int **ppiVar38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar39;
  undefined4 *puVar40;
  ulong uVar41;
  cpp_dec_float<200U,_int,_void> *pcVar42;
  soplex *psVar43;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar44;
  pointer pnVar45;
  uint uVar46;
  int *piVar47;
  ulong uVar48;
  long lVar49;
  long in_FS_OFFSET;
  bool bVar50;
  byte bVar51;
  Real RVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  Verbosity old_verbosity;
  undefined1 auStack_ce4 [12];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [16];
  uint local_c88 [3];
  undefined3 uStack_c7b;
  int iStack_c78;
  bool bStack_c74;
  long local_c70;
  Item *local_c60;
  int local_c54;
  int *perm_tmp;
  undefined8 local_c48;
  undefined8 uStack_c40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c38;
  undefined8 uStack_c30;
  long local_c28;
  DataArray<int> da_perm;
  DataArray<bool> isLhsEqualRhs;
  int *idxMem;
  int *local_ba8;
  undefined8 uStack_ba0;
  long local_b90;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  Item *local_ad0;
  DataArray<bool> local_ac8;
  DataArray<bool> local_ab0;
  DataArray<int> pClass;
  cpp_dec_float<200U,_int,_void> local_a78;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_9f0;
  Item *local_9e8;
  ulong local_9e0;
  ulong local_9d8;
  DataArray<int> classSize;
  int *perm;
  uint auStack_9b0 [25];
  undefined3 uStack_94b;
  int iStack_948;
  bool bStack_944;
  long local_940;
  DataArray<bool> remRow;
  shared_ptr<soplex::Tolerances> local_918;
  shared_ptr<soplex::Tolerances> local_908;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  DataArray<int> local_818;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_800;
  DataArray<int> local_7e8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_7d0;
  cpp_dec_float<200U,_int,_void> local_7b8;
  cpp_dec_float<200U,_int,_void> local_738;
  cpp_dec_float<200U,_int,_void> local_6b8;
  cpp_dec_float<200U,_int,_void> local_638;
  cpp_dec_float<200u,int,void> local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [13];
  undefined3 uStack_54b;
  int iStack_548;
  char cStack_544;
  long local_540;
  cpp_dec_float<200u,int,void> local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  int iStack_4c8;
  undefined1 uStack_4c4;
  undefined8 local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  uint local_3b0 [28];
  uint local_340 [28];
  uint local_2d0 [28];
  uint local_260 [28];
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  undefined4 local_a0 [28];
  
  bVar51 = 0;
  iVar20 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  RVar15 = removeEmpty(this,lp);
  if (RVar15 == OKAY) {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_ce4;
    _old_verbosity = auVar8 << 0x20;
    if ((lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum < 1) {
      iVar30 = 0;
    }
    else {
      iVar30 = 0;
      iVar16 = 0;
      do {
        pIVar27 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        iVar16 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[iVar16].idx;
        if (pIVar27[iVar16].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)(pIVar27 + iVar16),(int *)&old_verbosity);
          iVar30 = iVar30 + 1;
        }
        iVar16 = old_verbosity + WARNING;
        old_verbosity = iVar16;
      } while (iVar16 < (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    if (((0 < iVar30) &&
        (pSVar22 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout, pSVar22 != (SPxOut *)0x0)) && (3 < (int)pSVar22->m_verbosity)) {
      old_verbosity = pSVar22->m_verbosity;
      result_2.m_backend.data._M_elems[0] = 4;
      (*pSVar22->_vptr_SPxOut[2])();
      pSVar22 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar22->m_streams[pSVar22->m_verbosity],
                 "Simplifier duplicate rows (row singleton stage) removed ",0x38);
      std::ostream::operator<<((ostream *)pSVar22->m_streams[pSVar22->m_verbosity],iVar30);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar22->m_streams[pSVar22->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar22->m_streams[pSVar22->m_verbosity],iVar30);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar22->m_streams[pSVar22->m_verbosity]," non-zeros",10);
      cVar7 = (char)pSVar22->m_streams[pSVar22->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar22->m_streams[pSVar22->m_verbosity] + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      pSVar22 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar22->_vptr_SPxOut[2])(pSVar22,&old_verbosity);
    }
    pClass.thesize =
         (lp->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
    RVar15 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar30 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar30) {
        classSize.thesize = iVar30;
      }
      classSize.themax = 1;
      if (0 < iVar30) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      local_ba8 = idxMem;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      uVar46 = local_c48._4_4_;
      *classSize.data =
           (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
      local_c48 = (double)((ulong)local_c48._4_4_ << 0x20);
      if (1 < (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar31 = 1;
        local_c48 = (double)((ulong)uVar46 << 0x20);
        lVar49 = 0x80;
        do {
          pClass.data[lVar31] = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     ((long)((scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar49),0.0);
          classSize.data[lVar31] = 0;
          local_ba8[lVar31 + -1] = (int)lVar31;
          lVar31 = lVar31 + 1;
          local_c48 = (double)CONCAT44(local_c48._4_4_,(int)local_c48 + 1);
          lVar49 = lVar49 + 0x80;
        } while (lVar31 < (lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      local_4c0._0_4_ = cpp_dec_float_finite;
      local_4c0._4_4_ = 0x1c;
      local_538[0] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[1] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[2] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[3] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[4] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[5] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[6] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[7] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[8] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[9] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[10] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xb] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xc] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xd] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xe] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xf] = (cpp_dec_float<200u,int,void>)0x0;
      local_528 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      local_4e8 = (undefined1  [16])0x0;
      local_4d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_4cb = 0;
      iStack_4c8 = 0;
      uStack_4c4 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_538,0.0);
      if (0 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        lVar31 = 0;
        do {
          local_c60 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                      (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[lVar31].idx;
          local_b90 = lVar31;
          if (0 < (local_c60->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar31 = 0;
            lVar49 = 0;
            do {
              pNVar3 = (local_c60->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar37 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar31);
              pnVar39 = &result_2;
              for (lVar24 = 0x1c;
                  pnVar45 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start, lVar24 != 0;
                  lVar24 = lVar24 + -1) {
                (pnVar39->m_backend).data._M_elems[0] = *puVar37;
                puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
              }
              result_2.m_backend.exp = *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31);
              result_2.m_backend.neg =
                   *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31 + 4);
              result_2.m_backend._120_8_ =
                   *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31 + 8);
              lVar24 = (long)*(int *)((long)(&((local_c60->data).
                                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem)->val + 1) + lVar31);
              local_c38 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)lVar24;
              if (scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend.fpclass !=
                  cpp_dec_float_NaN) {
                local_c70._0_4_ = cpp_dec_float_finite;
                local_c70._4_4_ = 0x1c;
                _old_verbosity = (undefined1  [16])0x0;
                local_cd8 = (undefined1  [16])0x0;
                local_cc8 = (undefined1  [16])0x0;
                local_cb8 = (undefined1  [16])0x0;
                local_ca8 = (undefined1  [16])0x0;
                local_c98 = (undefined1  [16])0x0;
                local_c88[0] = 0;
                local_c88[1] = 0;
                stack0xfffffffffffff380 = 0;
                uStack_c7b = 0;
                iStack_c78 = 0;
                bStack_c74 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
                iVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&pnVar45[lVar24].m_backend,
                                    (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                if (iVar30 == 0) {
                  pnVar39 = &result_2;
                  pnVar45 = scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar24;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pnVar45->m_backend).data._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
                    pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                    pnVar45 = (pointer)((long)pnVar45 + ((ulong)bVar51 * -2 + 1) * 4);
                  }
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend.exp =
                       result_2.m_backend.exp;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend.neg =
                       result_2.m_backend.neg;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend.fpclass =
                       result_2.m_backend.fpclass;
                  scale.data.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend.prec_elem =
                       result_2.m_backend.prec_elem;
                }
              }
              pVVar1 = local_c38;
              iVar30 = pClass.data[(long)local_c38];
              pDVar26 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_c70 = 0x1c00000000;
              _old_verbosity = (undefined1  [16])0x0;
              local_cd8 = (undefined1  [16])0x0;
              local_cc8 = (undefined1  [16])0x0;
              local_cb8 = (undefined1  [16])0x0;
              local_ca8 = (undefined1  [16])0x0;
              local_c98 = (undefined1  [16])0x0;
              local_c88[0] = 0;
              local_c88[1] = 0;
              stack0xfffffffffffff380 = 0;
              uStack_c7b = 0;
              iStack_c78 = 0;
              bStack_c74 = false;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&result_2.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar24].m_backend);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar26 + iVar30,(int)pVVar1,
                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&old_verbosity);
              piVar47 = classSize.data + pClass.data[(long)pVVar1];
              *piVar47 = *piVar47 + -1;
              if (*piVar47 == 0) {
                lVar24 = (long)(int)local_c48;
                local_c48 = (double)CONCAT44(local_c48._4_4_,(int)local_c48 + 1);
                local_ba8[lVar24] = pClass.data[(long)pVVar1];
              }
              lVar49 = lVar49 + 1;
              lVar31 = lVar31 + 0x84;
            } while (lVar49 < (local_c60->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          if (0 < (local_c60->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            lVar31 = 0;
            do {
              iVar30 = pClass.data
                       [(local_c60->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem[lVar31].idx];
              local_c28 = lVar31;
              if (0 < (this->m_classSetRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar30].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused) {
                pTVar4 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  }
                }
                RVar52 = Tolerances::epsilon(pTVar4);
                local_540 = 0x1c00000000;
                local_5b8[0] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[1] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[2] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[3] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[4] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[5] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[6] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[7] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[8] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[9] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[10] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[0xb] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[0xc] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[0xd] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[0xe] = (cpp_dec_float<200u,int,void>)0x0;
                local_5b8[0xf] = (cpp_dec_float<200u,int,void>)0x0;
                local_5a8 = (undefined1  [16])0x0;
                local_598 = (undefined1  [16])0x0;
                local_588 = (undefined1  [16])0x0;
                local_578 = (undefined1  [16])0x0;
                local_568 = (undefined1  [16])0x0;
                local_558 = SUB1613((undefined1  [16])0x0,0);
                uStack_54b = 0;
                iStack_548 = 0;
                cStack_544 = '\0';
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          (local_5b8,RVar52);
                local_a78.fpclass = cpp_dec_float_finite;
                local_a78.prec_elem = 0x1c;
                local_a78.neg = false;
                local_a78.exp = 0;
                pcVar33 = local_5b8;
                pcVar28 = &local_a78;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pcVar28->data)._M_elems[0] = *(uint *)pcVar33;
                  pcVar33 = pcVar33 + (ulong)bVar51 * -8 + 4;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar51 * -8 + 4);
                }
                local_a78.exp = iStack_548;
                local_a78.neg = (bool)cStack_544;
                local_a78.fpclass = (undefined4)local_540;
                local_a78.prec_elem = local_540._4_4_;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                pDVar26 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar16 = pDVar26[iVar30].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                if (1 < iVar16) {
                  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                            (pDVar26[iVar30].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem,iVar16,(ElementCompare *)&local_a78,0,true);
                }
                iVar16 = *local_ba8;
                lVar31 = (long)(int)local_c48;
                local_c48 = (double)CONCAT44(local_c48._4_4_,(int)local_c48 + -1);
                *local_ba8 = local_ba8[lVar31 + -1];
                pDVar26 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar26[iVar30].
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused) {
                  pDVar2 = pDVar26 + iVar30;
                  lVar31 = 0;
                  lVar49 = 0;
                  do {
                    uVar9 = local_4c0;
                    uVar13 = uStack_4c4;
                    iVar17 = iStack_4c8;
                    if (lVar31 != 0) {
                      pNVar3 = (pDVar2->
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).m_elem;
                      puVar32 = (undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar31)
                      ;
                      puVar40 = local_a0;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        *puVar40 = *puVar32;
                        puVar32 = puVar32 + (ulong)bVar51 * -2 + 1;
                        puVar40 = puVar40 + (ulong)bVar51 * -2 + 1;
                      }
                      iVar19 = *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31);
                      bVar23 = *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31 + 4U);
                      local_c38 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)*(long *)((long)(&(pNVar3->val).m_backend.data + 1) +
                                              lVar31 + 8U);
                      uStack_c30 = 0;
                      pcVar33 = local_538;
                      puVar37 = local_110;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        *puVar37 = *(uint *)pcVar33;
                        pcVar33 = pcVar33 + ((ulong)bVar51 * -2 + 1) * 4;
                        puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                      }
                      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_430,this);
                      puVar32 = local_a0;
                      psVar43 = (soplex *)&perm;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        *(undefined4 *)psVar43 = *puVar32;
                        puVar32 = puVar32 + (ulong)bVar51 * -2 + 1;
                        psVar43 = psVar43 + (ulong)bVar51 * -8 + 4;
                      }
                      iStack_948 = iVar19;
                      bStack_944 = bVar23;
                      local_940 = (long)local_c38;
                      puVar37 = local_110;
                      pnVar39 = &factor;
                      for (lVar24 = 0x1c; uVar10 = local_4c0, lVar24 != 0; lVar24 = lVar24 + -1) {
                        (pnVar39->m_backend).data._M_elems[0] = *puVar37;
                        puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                        pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                      }
                      factor.m_backend.exp = iVar17;
                      factor.m_backend.neg = (bool)uVar13;
                      local_4c0._0_4_ = (fpclass_type)uVar9;
                      local_4c0._4_4_ = SUB84(uVar9,4);
                      factor.m_backend.fpclass = (fpclass_type)local_4c0;
                      factor.m_backend.prec_elem = local_4c0._4_4_;
                      local_4c0 = uVar10;
                      relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                                (&result_2,(soplex *)&perm,&factor,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x0);
                      local_c70._0_4_ = cpp_dec_float_finite;
                      local_c70._4_4_ = 0x1c;
                      bStack_c74 = false;
                      iStack_c78 = 0;
                      pnVar39 = &result_2;
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                        (pcVar28->data)._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
                        pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar28 + (ulong)bVar51 * -8 + 4);
                      }
                      iStack_c78 = result_2.m_backend.exp;
                      bStack_c74 = result_2.m_backend.neg;
                      local_c70._0_4_ = result_2.m_backend.fpclass;
                      local_c70._4_4_ = result_2.m_backend.prec_elem;
                      if ((result_2.m_backend.neg == true) &&
                         (old_verbosity != ERROR ||
                          result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                        bStack_c74 = false;
                      }
                      if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                          (local_430.fpclass != cpp_dec_float_NaN)) &&
                         (iVar17 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                   compare((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                           &local_430), 0 < iVar17)) {
                        iVar16 = *local_ba8;
                        lVar24 = (long)(int)local_c48;
                        local_c48 = (double)CONCAT44(local_c48._4_4_,(int)local_c48 + -1);
                        *local_ba8 = local_ba8[lVar24 + -1];
                      }
                    }
                    pNVar3 = (this->m_classSetRows).data.
                             super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar30].
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem;
                    pClass.data[*(int *)((long)(&pNVar3->val + 1) + lVar31)] = iVar16;
                    classSize.data[iVar16] = classSize.data[iVar16] + 1;
                    puVar32 = (undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar31);
                    pcVar33 = local_538;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      *(undefined4 *)pcVar33 = *puVar32;
                      puVar32 = puVar32 + (ulong)bVar51 * -2 + 1;
                      pcVar33 = pcVar33 + ((ulong)bVar51 * -2 + 1) * 4;
                    }
                    iStack_4c8 = *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31);
                    uStack_4c4 = *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar31 + 4U);
                    local_4c0 = *(undefined8 *)
                                 ((long)(&(pNVar3->val).m_backend.data + 1) + lVar31 + 8U);
                    lVar49 = lVar49 + 1;
                    pDVar26 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pDVar2 = pDVar26 + iVar30;
                    lVar31 = lVar31 + 0x84;
                  } while (lVar49 < (pDVar2->
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).memused);
                }
                pDVar26[iVar30].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused = 0;
              }
              lVar31 = local_c28 + 1;
            } while (lVar31 < (local_c60->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          lVar31 = local_b90 + 1;
        } while (lVar31 < (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      iVar30 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      remRow.data = (bool *)0x0;
      remRow.memFactor = 1.2;
      remRow.thesize = 0;
      if (0 < iVar30) {
        remRow.thesize = iVar30;
      }
      remRow.themax = 1;
      if (0 < iVar30) {
        remRow.themax = remRow.thesize;
      }
      spx_alloc<bool*>(&remRow.data,remRow.themax);
      auVar8 = _DAT_00601040;
      iVar30 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (0 < (long)iVar30) {
        pDVar26 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar31 = (long)iVar30 + -1;
        auVar53._8_4_ = (int)lVar31;
        auVar53._0_8_ = lVar31;
        auVar53._12_4_ = (int)((ulong)lVar31 >> 0x20);
        lVar31 = 0;
        auVar53 = auVar53 ^ _DAT_00601040;
        auVar54 = _DAT_00601020;
        auVar55 = _DAT_00601030;
        do {
          auVar56 = auVar55 ^ auVar8;
          iVar16 = auVar53._4_4_;
          if ((bool)(~(auVar56._4_4_ == iVar16 && auVar53._0_4_ < auVar56._0_4_ ||
                      iVar16 < auVar56._4_4_) & 1)) {
            *(undefined4 *)
             ((long)&(pDVar26->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar31) = 0;
          }
          if ((auVar56._12_4_ != auVar53._12_4_ || auVar56._8_4_ <= auVar53._8_4_) &&
              auVar56._12_4_ <= auVar53._12_4_) {
            *(undefined4 *)
             ((long)&pDVar26[1].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar31) = 0;
          }
          auVar56 = auVar54 ^ auVar8;
          iVar17 = auVar56._4_4_;
          if (iVar17 <= iVar16 && (iVar17 != iVar16 || auVar56._0_4_ <= auVar53._0_4_)) {
            *(undefined4 *)
             ((long)&pDVar26[2].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar31) = 0;
            *(undefined4 *)
             ((long)&pDVar26[3].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused + lVar31) = 0;
          }
          lVar49 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + 4;
          auVar55._8_8_ = lVar49 + 4;
          lVar49 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 4;
          auVar54._8_8_ = lVar49 + 4;
          lVar31 = lVar31 + 0x80;
        } while ((ulong)(iVar30 + 3U >> 2) << 7 != lVar31);
      }
      uVar46 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      uVar48 = (ulong)uVar46;
      if (0 < (int)uVar46) {
        lVar31 = 0;
        do {
          remRow.data[lVar31] = false;
          iVar30 = pClass.data[lVar31];
          pDVar26 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_c70 = 0x1c00000000;
          _old_verbosity = (undefined1  [16])0x0;
          local_cd8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          local_c98 = (undefined1  [16])0x0;
          local_c88[0] = 0;
          local_c88[1] = 0;
          stack0xfffffffffffff380 = 0;
          uStack_c7b = 0;
          iStack_c78 = 0;
          bStack_c74 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar26 + iVar30,(int)lVar31,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity);
          lVar31 = lVar31 + 1;
          uVar48 = (ulong)(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
        } while (lVar31 < (long)uVar48);
      }
      perm_tmp = (int *)0x0;
      iVar30 = (int)uVar48;
      spx_alloc<int*>(&perm_tmp,iVar30);
      uVar29 = uVar48 & 0xffffffff;
      if (0 < iVar30) {
        memset(perm_tmp,0,uVar29 * 4);
      }
      if ((lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        local_9e8 = (Item *)0xffffffff;
        local_ad0 = (Item *)0xffffffff;
      }
      else {
        pDVar26 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar27 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        pDVar6 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey;
        local_9e8 = (Item *)0xffffffff;
        uVar41 = 0;
        uVar46 = 0xffffffff;
        do {
          if ((1 < pDVar26[uVar41].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused) &&
             (pNVar3 = pDVar26[uVar41].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem,
             pIVar27[pDVar6[pNVar3->idx].idx].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused != 1)) {
            if ((int)uVar46 < 0) {
              uVar46 = (uint)uVar41;
            }
            if (1 < pDVar26[uVar41].
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              piVar47 = &pNVar3[1].idx;
              lVar31 = 1;
              do {
                perm_tmp[*piVar47] = -1;
                lVar31 = lVar31 + 1;
                piVar47 = piVar47 + 0x21;
              } while (lVar31 < pDVar26[uVar41].
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
            }
            local_9e8 = (Item *)(uVar41 & 0xffffffff);
          }
          uVar41 = uVar41 + 1;
        } while ((long)uVar41 <
                 (long)(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
        local_ad0 = (Item *)(ulong)uVar46;
      }
      if (0 < iVar30) {
        uVar41 = 0;
        iVar16 = 0;
        do {
          if (-1 < perm_tmp[uVar41]) {
            perm_tmp[uVar41] = iVar16;
            iVar16 = iVar16 + 1;
          }
          uVar41 = uVar41 + 1;
        } while (uVar29 != uVar41);
      }
      local_c38 = &(lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).left;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newLhsVec.val,&local_c38->val);
      pVVar1 = &(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newRhsVec.val,&pVVar1->val);
      iVar16 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      bVar14 = 0 < iVar16;
      if (iVar16 < 1) {
        bVar23 = false;
      }
      else {
        local_b90 = CONCAT71(local_b90._1_7_,bVar14);
        local_ba8 = *(int **)(in_FS_OFFSET + -8);
        uStack_ba0 = 0;
        local_c48 = -(double)local_ba8;
        uStack_c40 = 0x8000000000000000;
        local_9f0 = &this->m_hist;
        iVar16 = iVar30;
        if (iVar30 < 1) {
          iVar30 = 1;
          iVar16 = 0;
        }
        pIVar27 = (Item *)0x0;
        bVar23 = false;
        local_9e0 = uVar29;
        local_9d8 = uVar48;
        do {
          pDVar26 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar17 = pDVar26[(long)pIVar27].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          local_c60 = pIVar27;
          if ((1 < iVar17) &&
             ((lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey
               [(pDVar26[(long)pIVar27].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1)) {
            piVar47 = (this->m_stat).data;
            piVar47[0xc] = iVar17 + piVar47[0xc] + -1;
            ::soplex::infinity::__tls_init();
            local_7b8.fpclass = cpp_dec_float_finite;
            local_7b8.prec_elem = 0x1c;
            local_7b8.data._M_elems[0] = 0;
            local_7b8.data._M_elems[1] = 0;
            local_7b8.data._M_elems[2] = 0;
            local_7b8.data._M_elems[3] = 0;
            local_7b8.data._M_elems[4] = 0;
            local_7b8.data._M_elems[5] = 0;
            local_7b8.data._M_elems[6] = 0;
            local_7b8.data._M_elems[7] = 0;
            local_7b8.data._M_elems[8] = 0;
            local_7b8.data._M_elems[9] = 0;
            local_7b8.data._M_elems[10] = 0;
            local_7b8.data._M_elems[0xb] = 0;
            local_7b8.data._M_elems[0xc] = 0;
            local_7b8.data._M_elems[0xd] = 0;
            local_7b8.data._M_elems[0xe] = 0;
            local_7b8.data._M_elems[0xf] = 0;
            local_7b8.data._M_elems[0x10] = 0;
            local_7b8.data._M_elems[0x11] = 0;
            local_7b8.data._M_elems[0x12] = 0;
            local_7b8.data._M_elems[0x13] = 0;
            local_7b8.data._M_elems[0x14] = 0;
            local_7b8.data._M_elems[0x15] = 0;
            local_7b8.data._M_elems[0x16] = 0;
            local_7b8.data._M_elems[0x17] = 0;
            local_7b8.data._M_elems[0x18] = 0;
            local_7b8.data._M_elems[0x19] = 0;
            local_7b8.data._M_elems._104_5_ = 0;
            local_7b8.data._M_elems[0x1b]._1_3_ = 0;
            local_7b8.exp = 0;
            local_7b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_7b8,local_c48);
            ::soplex::infinity::__tls_init();
            local_c70 = 0x1c00000000;
            _old_verbosity = ZEXT816(0);
            local_cd8 = ZEXT816(0);
            local_cc8 = ZEXT816(0);
            local_cb8 = ZEXT816(0);
            local_ca8 = ZEXT816(0);
            local_c98 = ZEXT816(0);
            local_c88[0] = 0;
            local_c88[1] = 0;
            stack0xfffffffffffff380 = 0;
            uStack_c7b = 0;
            iStack_c78 = 0;
            bStack_c74 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_ba8);
            pcVar33 = (cpp_dec_float<200u,int,void> *)&old_verbosity;
            pcVar28 = &local_638;
            for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
              (pcVar28->data)._M_elems[0] = *(uint *)pcVar33;
              pcVar33 = pcVar33 + (ulong)bVar51 * -8 + 4;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
            }
            local_638.exp = iStack_c78;
            local_638.neg = bStack_c74;
            local_638.fpclass = (fpclass_type)local_c70;
            local_638.prec_elem = local_c70._4_4_;
            isLhsEqualRhs.themax =
                 (this->m_dupRows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pIVar27].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
            isLhsEqualRhs.data = (bool *)0x0;
            isLhsEqualRhs.memFactor = 1.2;
            isLhsEqualRhs.thesize = isLhsEqualRhs.themax;
            if (isLhsEqualRhs.themax < 1) {
              isLhsEqualRhs.thesize = 0;
              isLhsEqualRhs.themax = 1;
            }
            spx_alloc<bool*>(&isLhsEqualRhs.data,isLhsEqualRhs.themax);
            pDVar26 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pDVar26[(long)pIVar27].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused < 1) {
              iVar17 = -1;
              local_c28 = CONCAT44(local_c28._4_4_,0xffffffff);
              local_c54 = -1;
            }
            else {
              pDVar26 = pDVar26 + (long)pIVar27;
              local_c54 = -1;
              lVar49 = 0x80;
              lVar31 = 0;
              local_c28 = CONCAT44(local_c28._4_4_,0xffffffff);
              iVar17 = -1;
              do {
                iVar19 = *(int *)((long)(((pDVar26->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).m_elem)->val).m_backend.data._M_elems + lVar49);
                pnVar45 = (local_c38->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar50 = false;
                if ((pnVar45[iVar19].m_backend.fpclass != cpp_dec_float_NaN) &&
                   (pnVar35 = (pVVar1->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start, bVar50 = false,
                   pnVar35[iVar19].m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&pnVar45[iVar19].m_backend,&pnVar35[iVar19].m_backend);
                  bVar50 = iVar18 == 0;
                }
                isLhsEqualRhs.data[lVar31] = bVar50;
                if (iVar17 == -1) {
                  pnVar45 = (local_c38->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pnVar35 = pnVar45 + iVar19;
                  pcVar28 = &local_7b8;
                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                    (pcVar28->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
                    pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar51 * -2 + 1) * 4);
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar51 * -8 + 4);
                  }
                  local_7b8.exp = pnVar45[iVar19].m_backend.exp;
                  local_7b8.neg = pnVar45[iVar19].m_backend.neg;
                  local_7b8.fpclass = pnVar45[iVar19].m_backend.fpclass;
                  local_7b8.prec_elem = pnVar45[iVar19].m_backend.prec_elem;
                  pnVar45 = (pVVar1->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pnVar35 = pnVar45 + iVar19;
                  pcVar28 = &local_638;
                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                    (pcVar28->data)._M_elems[0] = (pnVar35->m_backend).data._M_elems[0];
                    pnVar35 = (pointer)((long)pnVar35 + ((ulong)bVar51 * -2 + 1) * 4);
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  }
                  local_638.exp = pnVar45[iVar19].m_backend.exp;
                  local_638.neg = pnVar45[iVar19].m_backend.neg;
                  local_638.fpclass = pnVar45[iVar19].m_backend.fpclass;
                  local_638.prec_elem = pnVar45[iVar19].m_backend.prec_elem;
                  iVar17 = iVar19;
                }
                else {
                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                  result_2.m_backend.prec_elem = 0x1c;
                  result_2.m_backend.data._M_elems[0] = 0;
                  result_2.m_backend.data._M_elems[1] = 0;
                  result_2.m_backend.data._M_elems[2] = 0;
                  result_2.m_backend.data._M_elems[3] = 0;
                  result_2.m_backend.data._M_elems[4] = 0;
                  result_2.m_backend.data._M_elems[5] = 0;
                  result_2.m_backend.data._M_elems[6] = 0;
                  result_2.m_backend.data._M_elems[7] = 0;
                  result_2.m_backend.data._M_elems[8] = 0;
                  result_2.m_backend.data._M_elems[9] = 0;
                  result_2.m_backend.data._M_elems[10] = 0;
                  result_2.m_backend.data._M_elems[0xb] = 0;
                  result_2.m_backend.data._M_elems[0xc] = 0;
                  result_2.m_backend.data._M_elems[0xd] = 0;
                  result_2.m_backend.data._M_elems[0xe] = 0;
                  result_2.m_backend.data._M_elems[0xf] = 0;
                  result_2.m_backend.data._M_elems[0x10] = 0;
                  result_2.m_backend.data._M_elems[0x11] = 0;
                  result_2.m_backend.data._M_elems[0x12] = 0;
                  result_2.m_backend.data._M_elems[0x13] = 0;
                  result_2.m_backend.data._M_elems[0x14] = 0;
                  result_2.m_backend.data._M_elems[0x15] = 0;
                  result_2.m_backend.data._M_elems[0x16] = 0;
                  result_2.m_backend.data._M_elems[0x17] = 0;
                  result_2.m_backend.data._M_elems[0x18] = 0;
                  result_2.m_backend.data._M_elems[0x19] = 0;
                  result_2.m_backend.data._M_elems._104_5_ = 0;
                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_2.m_backend.exp = 0;
                  result_2.m_backend.neg = false;
                  local_940._0_4_ = cpp_dec_float_finite;
                  local_940._4_4_ = 0x1c;
                  perm = (int *)0x0;
                  auStack_9b0[0] = 0;
                  auStack_9b0[1] = 0;
                  auStack_9b0[2] = 0;
                  auStack_9b0[3] = 0;
                  auStack_9b0[4] = 0;
                  auStack_9b0[5] = 0;
                  auStack_9b0[6] = 0;
                  auStack_9b0[7] = 0;
                  auStack_9b0[8] = 0;
                  auStack_9b0[9] = 0;
                  auStack_9b0[10] = 0;
                  auStack_9b0[0xb] = 0;
                  auStack_9b0[0xc] = 0;
                  auStack_9b0[0xd] = 0;
                  auStack_9b0[0xe] = 0;
                  auStack_9b0[0xf] = 0;
                  auStack_9b0[0x10] = 0;
                  auStack_9b0[0x11] = 0;
                  auStack_9b0[0x12] = 0;
                  auStack_9b0[0x13] = 0;
                  auStack_9b0[0x14] = 0;
                  auStack_9b0[0x15] = 0;
                  auStack_9b0[0x16] = 0;
                  auStack_9b0[0x17] = 0;
                  stack0xfffffffffffff6b0 = 0;
                  uStack_94b = 0;
                  iStack_948 = 0;
                  bStack_944 = false;
                  factor.m_backend.fpclass = cpp_dec_float_finite;
                  factor.m_backend.prec_elem = 0x1c;
                  factor.m_backend.data._M_elems[0] = 0;
                  factor.m_backend.data._M_elems[1] = 0;
                  factor.m_backend.data._M_elems[2] = 0;
                  factor.m_backend.data._M_elems[3] = 0;
                  factor.m_backend.data._M_elems[4] = 0;
                  factor.m_backend.data._M_elems[5] = 0;
                  factor.m_backend.data._M_elems[6] = 0;
                  factor.m_backend.data._M_elems[7] = 0;
                  factor.m_backend.data._M_elems[8] = 0;
                  factor.m_backend.data._M_elems[9] = 0;
                  factor.m_backend.data._M_elems[10] = 0;
                  factor.m_backend.data._M_elems[0xb] = 0;
                  factor.m_backend.data._M_elems[0xc] = 0;
                  factor.m_backend.data._M_elems[0xd] = 0;
                  factor.m_backend.data._M_elems[0xe] = 0;
                  factor.m_backend.data._M_elems[0xf] = 0;
                  factor.m_backend.data._M_elems[0x10] = 0;
                  factor.m_backend.data._M_elems[0x11] = 0;
                  factor.m_backend.data._M_elems[0x12] = 0;
                  factor.m_backend.data._M_elems[0x13] = 0;
                  factor.m_backend.data._M_elems[0x14] = 0;
                  factor.m_backend.data._M_elems[0x15] = 0;
                  factor.m_backend.data._M_elems[0x16] = 0;
                  factor.m_backend.data._M_elems[0x17] = 0;
                  factor.m_backend.data._M_elems[0x18] = 0;
                  factor.m_backend.data._M_elems[0x19] = 0;
                  factor.m_backend.data._M_elems._104_5_ = 0;
                  factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  factor.m_backend.exp = 0;
                  factor.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&factor.m_backend,
                             &scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend,
                             &scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend);
                  if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00566f87:
                    pcVar28 = &(pVVar1->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_a78.fpclass = cpp_dec_float_finite;
                    local_a78.prec_elem = 0x1c;
                    local_a78.data._M_elems[0] = 0;
                    local_a78.data._M_elems[1] = 0;
                    local_a78.data._M_elems[2] = 0;
                    local_a78.data._M_elems[3] = 0;
                    local_a78.data._M_elems[4] = 0;
                    local_a78.data._M_elems[5] = 0;
                    local_a78.data._M_elems[6] = 0;
                    local_a78.data._M_elems[7] = 0;
                    local_a78.data._M_elems[8] = 0;
                    local_a78.data._M_elems[9] = 0;
                    local_a78.data._M_elems[10] = 0;
                    local_a78.data._M_elems[0xb] = 0;
                    local_a78.data._M_elems[0xc] = 0;
                    local_a78.data._M_elems[0xd] = 0;
                    local_a78.data._M_elems[0xe] = 0;
                    local_a78.data._M_elems[0xf] = 0;
                    local_a78.data._M_elems[0x10] = 0;
                    local_a78.data._M_elems[0x11] = 0;
                    local_a78.data._M_elems[0x12] = 0;
                    local_a78.data._M_elems[0x13] = 0;
                    local_a78.data._M_elems[0x14] = 0;
                    local_a78.data._M_elems[0x15] = 0;
                    local_a78.data._M_elems[0x16] = 0;
                    local_a78.data._M_elems[0x17] = 0;
                    local_a78.data._M_elems[0x18] = 0;
                    local_a78.data._M_elems[0x19] = 0;
                    local_a78.data._M_elems._104_5_ = 0;
                    local_a78.data._M_elems[0x1b]._1_3_ = 0;
                    local_a78.exp = 0;
                    local_a78.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)&local_a78,(double)local_ba8);
                    if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                        (local_a78.fpclass == cpp_dec_float_NaN)) ||
                       (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(pcVar28,&local_a78), iVar18 < 0)) {
                      pcVar28 = &(pVVar1->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                      local_c70._0_4_ = cpp_dec_float_finite;
                      local_c70._4_4_ = 0x1c;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                        pcVar36 = pcVar28;
                        pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                          (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                          pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar36 + (ulong)bVar51 * -8 + 4);
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar42 + (ulong)bVar51 * -8 + 4);
                        }
                        iStack_c78 = pcVar28->exp;
                        bStack_c74 = pcVar28->neg;
                        local_c70._0_4_ = pcVar28->fpclass;
                        local_c70._4_4_ = pcVar28->prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&factor.m_backend)
                      ;
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_c70._0_4_ = cpp_dec_float_finite;
                      local_c70._4_4_ = 0x1c;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,local_c48);
                    }
                    pVVar34 = &old_verbosity;
                    pnVar39 = &result_2;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pnVar39->m_backend).data._M_elems[0] = *pVVar34;
                      pVVar34 = pVVar34 + (ulong)bVar51 * -2 + 1;
                      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                    }
                    result_2.m_backend.exp = iStack_c78;
                    result_2.m_backend.neg = bStack_c74;
                    result_2.m_backend.fpclass = (fpclass_type)local_c70;
                    result_2.m_backend.prec_elem = local_c70._4_4_;
                    pcVar28 = &(local_c38->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_a78.fpclass = cpp_dec_float_finite;
                    local_a78.prec_elem = 0x1c;
                    local_a78.data._M_elems[0] = 0;
                    local_a78.data._M_elems[1] = 0;
                    local_a78.data._M_elems[2] = 0;
                    local_a78.data._M_elems[3] = 0;
                    local_a78.data._M_elems[4] = 0;
                    local_a78.data._M_elems[5] = 0;
                    local_a78.data._M_elems[6] = 0;
                    local_a78.data._M_elems[7] = 0;
                    local_a78.data._M_elems[8] = 0;
                    local_a78.data._M_elems[9] = 0;
                    local_a78.data._M_elems[10] = 0;
                    local_a78.data._M_elems[0xb] = 0;
                    local_a78.data._M_elems[0xc] = 0;
                    local_a78.data._M_elems[0xd] = 0;
                    local_a78.data._M_elems[0xe] = 0;
                    local_a78.data._M_elems[0xf] = 0;
                    local_a78.data._M_elems[0x10] = 0;
                    local_a78.data._M_elems[0x11] = 0;
                    local_a78.data._M_elems[0x12] = 0;
                    local_a78.data._M_elems[0x13] = 0;
                    local_a78.data._M_elems[0x14] = 0;
                    local_a78.data._M_elems[0x15] = 0;
                    local_a78.data._M_elems[0x16] = 0;
                    local_a78.data._M_elems[0x17] = 0;
                    local_a78.data._M_elems[0x18] = 0;
                    local_a78.data._M_elems[0x19] = 0;
                    local_a78.data._M_elems._104_5_ = 0;
                    local_a78.data._M_elems[0x1b]._1_3_ = 0;
                    local_a78.exp = 0;
                    local_a78.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)&local_a78,local_c48);
                    if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                        (local_a78.fpclass == cpp_dec_float_NaN)) ||
                       (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(pcVar28,&local_a78), 0 < iVar18)) {
                      pcVar28 = &(local_c38->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                      local_c70 = 0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                        pcVar36 = pcVar28;
                        pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                          (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                          pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar36 + (ulong)bVar51 * -8 + 4);
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar42 + (ulong)bVar51 * -8 + 4);
                        }
                        iStack_c78 = pcVar28->exp;
                        bStack_c74 = pcVar28->neg;
                        local_c70._0_4_ = pcVar28->fpclass;
                        local_c70._4_4_ = pcVar28->prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&factor.m_backend)
                      ;
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_c70 = 0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_ba8);
                    }
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<long_long>
                              ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0,(type *)0x0);
                    iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&factor.m_backend,
                                     (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                    if (iVar18 < 1) goto LAB_00566f87;
                    pcVar28 = &(local_c38->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_a78.fpclass = cpp_dec_float_finite;
                    local_a78.prec_elem = 0x1c;
                    local_a78.data._M_elems[0] = 0;
                    local_a78.data._M_elems[1] = 0;
                    local_a78.data._M_elems[2] = 0;
                    local_a78.data._M_elems[3] = 0;
                    local_a78.data._M_elems[4] = 0;
                    local_a78.data._M_elems[5] = 0;
                    local_a78.data._M_elems[6] = 0;
                    local_a78.data._M_elems[7] = 0;
                    local_a78.data._M_elems[8] = 0;
                    local_a78.data._M_elems[9] = 0;
                    local_a78.data._M_elems[10] = 0;
                    local_a78.data._M_elems[0xb] = 0;
                    local_a78.data._M_elems[0xc] = 0;
                    local_a78.data._M_elems[0xd] = 0;
                    local_a78.data._M_elems[0xe] = 0;
                    local_a78.data._M_elems[0xf] = 0;
                    local_a78.data._M_elems[0x10] = 0;
                    local_a78.data._M_elems[0x11] = 0;
                    local_a78.data._M_elems[0x12] = 0;
                    local_a78.data._M_elems[0x13] = 0;
                    local_a78.data._M_elems[0x14] = 0;
                    local_a78.data._M_elems[0x15] = 0;
                    local_a78.data._M_elems[0x16] = 0;
                    local_a78.data._M_elems[0x17] = 0;
                    local_a78.data._M_elems[0x18] = 0;
                    local_a78.data._M_elems[0x19] = 0;
                    local_a78.data._M_elems._104_5_ = 0;
                    local_a78.data._M_elems[0x1b]._1_3_ = 0;
                    local_a78.exp = 0;
                    local_a78.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)&local_a78,local_c48);
                    if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                        (local_a78.fpclass == cpp_dec_float_NaN)) ||
                       (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(pcVar28,&local_a78), 0 < iVar18)) {
                      pcVar28 = &(local_c38->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                      local_c70._0_4_ = cpp_dec_float_finite;
                      local_c70._4_4_ = 0x1c;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                        pcVar36 = pcVar28;
                        pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                          (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                          pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar36 + (ulong)bVar51 * -8 + 4);
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar42 + (ulong)bVar51 * -8 + 4);
                        }
                        iStack_c78 = pcVar28->exp;
                        bStack_c74 = pcVar28->neg;
                        local_c70._0_4_ = pcVar28->fpclass;
                        local_c70._4_4_ = pcVar28->prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&factor.m_backend)
                      ;
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_c70._0_4_ = cpp_dec_float_finite;
                      local_c70._4_4_ = 0x1c;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,local_c48);
                    }
                    pVVar34 = &old_verbosity;
                    pnVar39 = &result_2;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pnVar39->m_backend).data._M_elems[0] = *pVVar34;
                      pVVar34 = pVVar34 + (ulong)bVar51 * -2 + 1;
                      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                    }
                    result_2.m_backend.exp = iStack_c78;
                    result_2.m_backend.neg = bStack_c74;
                    result_2.m_backend.fpclass = (fpclass_type)local_c70;
                    result_2.m_backend.prec_elem = local_c70._4_4_;
                    pcVar28 = &(pVVar1->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                    ::soplex::infinity::__tls_init();
                    local_a78.fpclass = cpp_dec_float_finite;
                    local_a78.prec_elem = 0x1c;
                    local_a78.data._M_elems[0] = 0;
                    local_a78.data._M_elems[1] = 0;
                    local_a78.data._M_elems[2] = 0;
                    local_a78.data._M_elems[3] = 0;
                    local_a78.data._M_elems[4] = 0;
                    local_a78.data._M_elems[5] = 0;
                    local_a78.data._M_elems[6] = 0;
                    local_a78.data._M_elems[7] = 0;
                    local_a78.data._M_elems[8] = 0;
                    local_a78.data._M_elems[9] = 0;
                    local_a78.data._M_elems[10] = 0;
                    local_a78.data._M_elems[0xb] = 0;
                    local_a78.data._M_elems[0xc] = 0;
                    local_a78.data._M_elems[0xd] = 0;
                    local_a78.data._M_elems[0xe] = 0;
                    local_a78.data._M_elems[0xf] = 0;
                    local_a78.data._M_elems[0x10] = 0;
                    local_a78.data._M_elems[0x11] = 0;
                    local_a78.data._M_elems[0x12] = 0;
                    local_a78.data._M_elems[0x13] = 0;
                    local_a78.data._M_elems[0x14] = 0;
                    local_a78.data._M_elems[0x15] = 0;
                    local_a78.data._M_elems[0x16] = 0;
                    local_a78.data._M_elems[0x17] = 0;
                    local_a78.data._M_elems[0x18] = 0;
                    local_a78.data._M_elems[0x19] = 0;
                    local_a78.data._M_elems._104_5_ = 0;
                    local_a78.data._M_elems[0x1b]._1_3_ = 0;
                    local_a78.exp = 0;
                    local_a78.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                              ((cpp_dec_float<200u,int,void> *)&local_a78,(double)local_ba8);
                    if (((pcVar28->fpclass == cpp_dec_float_NaN) ||
                        (local_a78.fpclass == cpp_dec_float_NaN)) ||
                       (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                 compare(pcVar28,&local_a78), iVar18 < 0)) {
                      pcVar28 = &(pVVar1->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
                      local_c70 = 0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      if ((cpp_dec_float<200U,_int,_void> *)&old_verbosity != pcVar28) {
                        pcVar36 = pcVar28;
                        pcVar42 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
                        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                          (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                          pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar36 + (ulong)bVar51 * -8 + 4);
                          pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar42 + (ulong)bVar51 * -8 + 4);
                        }
                        iStack_c78 = pcVar28->exp;
                        bStack_c74 = pcVar28->neg;
                        local_c70._0_4_ = pcVar28->fpclass;
                        local_c70._4_4_ = pcVar28->prec_elem;
                      }
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&factor.m_backend)
                      ;
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_c70 = 0x1c00000000;
                      _old_verbosity = ZEXT816(0);
                      local_cd8 = ZEXT816(0);
                      local_cc8 = ZEXT816(0);
                      local_cb8 = ZEXT816(0);
                      local_ca8 = ZEXT816(0);
                      local_c98 = ZEXT816(0);
                      local_c88[0] = 0;
                      local_c88[1] = 0;
                      stack0xfffffffffffff380 = 0;
                      uStack_c7b = 0;
                      iStack_c78 = 0;
                      bStack_c74 = false;
                      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                                ((cpp_dec_float<200u,int,void> *)&old_verbosity,(double)local_ba8);
                    }
                  }
                  pVVar34 = &old_verbosity;
                  ppiVar38 = &perm;
                  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                    *(Verbosity *)ppiVar38 = *pVVar34;
                    pVVar34 = pVVar34 + (ulong)bVar51 * -2 + 1;
                    ppiVar38 = (int **)((long)ppiVar38 + (ulong)bVar51 * -8 + 4);
                  }
                  iStack_948 = iStack_c78;
                  bStack_944 = bStack_c74;
                  local_940 = local_c70;
                  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                      (local_7b8.fpclass != cpp_dec_float_NaN)) &&
                     (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&result_2.m_backend,&local_7b8), 0 < iVar18)) {
                    pnVar39 = &result_2;
                    pcVar28 = &local_7b8;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pcVar28->data)._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
                      pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                    }
                    local_7b8.exp = result_2.m_backend.exp;
                    local_7b8.neg = result_2.m_backend.neg;
                    local_7b8.fpclass = result_2.m_backend.fpclass;
                    local_7b8.prec_elem = result_2.m_backend.prec_elem;
                    local_c28 = CONCAT44(local_c28._4_4_,iVar19);
                  }
                  if ((((fpclass_type)local_940 != cpp_dec_float_NaN) &&
                      (local_638.fpclass != cpp_dec_float_NaN)) &&
                     (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare((cpp_dec_float<200U,_int,_void> *)&perm,&local_638),
                     iVar18 < 0)) {
                    ppiVar38 = &perm;
                    pcVar28 = &local_638;
                    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
                      (pcVar28->data)._M_elems[0] = *(uint *)ppiVar38;
                      ppiVar38 = (int **)((long)ppiVar38 + (ulong)bVar51 * -8 + 4);
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                    }
                    local_638.exp = iStack_948;
                    local_638.neg = bStack_944;
                    local_638.fpclass = (fpclass_type)local_940;
                    local_638.prec_elem = local_940._4_4_;
                    local_c54 = iVar19;
                  }
                  remRow.data[iVar19] = true;
                }
                lVar31 = lVar31 + 1;
                pDVar26 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)pIVar27;
                lVar49 = lVar49 + 0x84;
              } while (lVar31 < (pDVar26->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).memused);
            }
            uVar48 = local_9e0;
            if (iVar17 == -1) {
              bVar50 = true;
            }
            else {
              iVar19 = (int)local_9d8;
              pcVar28 = &local_7b8;
              if (((local_7b8.fpclass == cpp_dec_float_NaN) ||
                  (pnVar45 = (local_c38->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  pnVar45[iVar17].m_backend.fpclass == cpp_dec_float_NaN)) ||
                 (iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (pcVar28,&pnVar45[iVar17].m_backend), iVar18 < 1)) {
                pcVar28 = &(local_c38->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
              }
              pcVar36 = pcVar28;
              pcVar42 = &local_6b8;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar51 * -8 + 4)
                ;
                pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar42 + ((ulong)bVar51 * -2 + 1) * 4);
              }
              local_6b8.exp = pcVar28->exp;
              local_6b8.neg = pcVar28->neg;
              local_6b8.fpclass = pcVar28->fpclass;
              local_6b8.prec_elem = pcVar28->prec_elem;
              if ((local_638.fpclass == cpp_dec_float_NaN) ||
                 (pnVar45 = (pVVar1->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pnVar45[iVar17].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_0056779b:
                pcVar28 = &(pVVar1->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend;
              }
              else {
                iVar18 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_638,&pnVar45[iVar17].m_backend);
                pcVar28 = &local_638;
                iVar19 = (int)local_9d8;
                uVar48 = local_9e0;
                if (-1 < iVar18) goto LAB_0056779b;
              }
              pcVar36 = pcVar28;
              pcVar42 = &local_738;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                (pcVar42->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
                pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar36 + ((ulong)bVar51 * -2 + 1) * 4);
                pcVar42 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar42 + ((ulong)bVar51 * -2 + 1) * 4);
              }
              local_738.exp = pcVar28->exp;
              local_738.neg = pcVar28->neg;
              local_738.fpclass = pcVar28->fpclass;
              local_738.prec_elem = pcVar28->prec_elem;
              if (local_c60 == local_9e8) {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.themax = iVar30;
                da_perm.thesize = iVar16;
                spx_alloc<int*>(&da_perm.data,iVar30);
                if (0 < iVar19) {
                  uVar29 = 0;
                  do {
                    da_perm.data[uVar29] = perm_tmp[uVar29];
                    uVar29 = uVar29 + 1;
                  } while (uVar48 != uVar29);
                }
                pDVar21 = (DuplicateRowsPS *)operator_new(0x148);
                pDVar26 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array(&local_7d0,&scale);
                DataArray<int>::DataArray(&local_7e8,&da_perm);
                local_ab0.thesize = isLhsEqualRhs.thesize;
                local_ab0.themax = isLhsEqualRhs.themax;
                local_ab0.data = (bool *)0x0;
                local_ab0.memFactor = isLhsEqualRhs.memFactor;
                spx_alloc<bool*>(&local_ab0.data,isLhsEqualRhs.themax);
                if ((ulong)(uint)local_ab0.thesize != 0) {
                  memcpy(local_ab0.data,isLhsEqualRhs.data,(ulong)(uint)local_ab0.thesize);
                }
                uVar10 = local_6b8._120_8_;
                bVar12 = local_6b8.neg;
                iVar18 = local_6b8.exp;
                uVar9 = local_738._120_8_;
                bVar50 = local_738.neg;
                iVar19 = local_738.exp;
                pcVar28 = &local_6b8;
                puVar37 = local_180;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  *puVar37 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                }
                pcVar28 = &local_738;
                puVar37 = local_1f0;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  *puVar37 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                }
                pTVar4 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  }
                }
                RVar52 = Tolerances::epsilon(pTVar4);
                puVar37 = local_180;
                psVar43 = (soplex *)&factor;
                for (lVar31 = 0x1c; uVar11 = local_6b8._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                  *(uint *)psVar43 = *puVar37;
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                  psVar43 = psVar43 + (ulong)bVar51 * -8 + 4;
                }
                factor.m_backend.exp = iVar18;
                factor.m_backend.neg = bVar12;
                local_6b8.fpclass = (fpclass_type)uVar10;
                local_6b8.prec_elem = SUB84(uVar10,4);
                factor.m_backend.fpclass = local_6b8.fpclass;
                factor.m_backend.prec_elem = local_6b8.prec_elem;
                puVar37 = local_1f0;
                pcVar28 = &local_a78;
                local_6b8._120_8_ = uVar11;
                for (lVar31 = 0x1c; uVar10 = local_738._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                  (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] = *puVar37;
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                local_a78.exp = iVar19;
                local_a78.neg = bVar50;
                local_738.fpclass = (fpclass_type)uVar9;
                local_738.prec_elem = SUB84(uVar9,4);
                local_a78.fpclass = local_738.fpclass;
                local_a78.prec_elem = local_738.prec_elem;
                local_738._120_8_ = uVar10;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&perm,(soplex *)&factor,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 0x1c;
                result_2.m_backend.neg = false;
                result_2.m_backend.exp = 0;
                ppiVar38 = &perm;
                pnVar39 = &result_2;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pnVar39->m_backend).data._M_elems[0] = *(uint *)ppiVar38;
                  ppiVar38 = (int **)((long)ppiVar38 + (ulong)bVar51 * -8 + 4);
                  pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                result_2.m_backend.exp = iStack_948;
                result_2.m_backend.neg = bStack_944;
                result_2.m_backend.fpclass = (fpclass_type)local_940;
                result_2.m_backend.prec_elem = local_940._4_4_;
                if ((bStack_944 == true) &&
                   (result_2.m_backend.data._M_elems[0] != 0 || (int)local_940 != 0)) {
                  result_2.m_backend.neg = false;
                }
                if (NAN(RVar52) || (int)local_940 == 2) {
                  bVar50 = false;
                }
                else {
                  local_c70 = 0x1c00000000;
                  _old_verbosity = ZEXT816(0);
                  local_cd8 = ZEXT816(0);
                  local_cc8 = ZEXT816(0);
                  local_cb8 = ZEXT816(0);
                  local_ca8 = ZEXT816(0);
                  local_c98 = ZEXT816(0);
                  local_c88[0] = 0;
                  local_c88[1] = 0;
                  stack0xfffffffffffff380 = 0;
                  uStack_c7b = 0;
                  iStack_c78 = 0;
                  bStack_c74 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)&old_verbosity,RVar52);
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&result_2.m_backend,
                                      (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                  bVar50 = iVar19 < 1;
                }
                local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_908.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_908.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar21,lp,iVar17,(int)local_c28,local_c54,pDVar26 + (long)pIVar27,
                           &local_7d0,&local_7e8,&local_ab0,true,bVar50,&local_908,
                           local_c60 == local_ad0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pDVar21;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar21);
                if (local_908.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_908.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (local_ab0.data != (bool *)0x0) {
                  free(local_ab0.data);
                  local_ab0.data = (bool *)0x0;
                }
                if (local_7e8.data != (int *)0x0) {
                  free(local_7e8.data);
                  local_7e8.data = (int *)0x0;
                }
                if (local_7d0.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_7d0.data.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_7d0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_7d0.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                ::push_back(&local_9f0->data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              else {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.thesize = 0;
                da_perm.themax = 1;
                spx_alloc<int*>(&da_perm.data,1);
                pDVar21 = (DuplicateRowsPS *)operator_new(0x148);
                pDVar26 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array(&local_800,&scale);
                DataArray<int>::DataArray(&local_818,&da_perm);
                local_ac8.thesize = isLhsEqualRhs.thesize;
                local_ac8.themax = isLhsEqualRhs.themax;
                local_ac8.data = (bool *)0x0;
                local_ac8.memFactor = isLhsEqualRhs.memFactor;
                spx_alloc<bool*>(&local_ac8.data,isLhsEqualRhs.themax);
                if ((ulong)(uint)local_ac8.thesize != 0) {
                  memcpy(local_ac8.data,isLhsEqualRhs.data,(ulong)(uint)local_ac8.thesize);
                }
                uVar10 = local_6b8._120_8_;
                bVar12 = local_6b8.neg;
                iVar18 = local_6b8.exp;
                uVar9 = local_738._120_8_;
                bVar50 = local_738.neg;
                iVar19 = local_738.exp;
                pcVar28 = &local_6b8;
                puVar37 = local_260;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  *puVar37 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                }
                pcVar28 = &local_738;
                puVar37 = local_2d0;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  *puVar37 = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                }
                pTVar4 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  }
                }
                RVar52 = Tolerances::epsilon(pTVar4);
                puVar37 = local_260;
                psVar43 = (soplex *)&factor;
                for (lVar31 = 0x1c; uVar11 = local_6b8._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                  *(uint *)psVar43 = *puVar37;
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                  psVar43 = psVar43 + (ulong)bVar51 * -8 + 4;
                }
                factor.m_backend.exp = iVar18;
                factor.m_backend.neg = bVar12;
                local_6b8.fpclass = (fpclass_type)uVar10;
                local_6b8.prec_elem = SUB84(uVar10,4);
                factor.m_backend.fpclass = local_6b8.fpclass;
                factor.m_backend.prec_elem = local_6b8.prec_elem;
                puVar37 = local_2d0;
                pcVar28 = &local_a78;
                local_6b8._120_8_ = uVar11;
                for (lVar31 = 0x1c; uVar10 = local_738._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                  (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] = *puVar37;
                  puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                local_a78.exp = iVar19;
                local_a78.neg = bVar50;
                local_738.fpclass = (fpclass_type)uVar9;
                local_738.prec_elem = SUB84(uVar9,4);
                local_a78.fpclass = local_738.fpclass;
                local_a78.prec_elem = local_738.prec_elem;
                local_738._120_8_ = uVar10;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&perm,(soplex *)&factor,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                result_2.m_backend.fpclass = cpp_dec_float_finite;
                result_2.m_backend.prec_elem = 0x1c;
                result_2.m_backend.neg = false;
                result_2.m_backend.exp = 0;
                ppiVar38 = &perm;
                pnVar39 = &result_2;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pnVar39->m_backend).data._M_elems[0] = *(uint *)ppiVar38;
                  ppiVar38 = (int **)((long)ppiVar38 + (ulong)bVar51 * -8 + 4);
                  pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                result_2.m_backend.exp = iStack_948;
                result_2.m_backend.neg = bStack_944;
                result_2.m_backend.fpclass = (fpclass_type)local_940;
                result_2.m_backend.prec_elem = local_940._4_4_;
                if ((bStack_944 == true) &&
                   (result_2.m_backend.data._M_elems[0] != 0 || (int)local_940 != 0)) {
                  result_2.m_backend.neg = false;
                }
                if (NAN(RVar52) || (int)local_940 == 2) {
                  bVar50 = false;
                }
                else {
                  local_c70 = 0x1c00000000;
                  _old_verbosity = ZEXT816(0);
                  local_cd8 = ZEXT816(0);
                  local_cc8 = ZEXT816(0);
                  local_cb8 = ZEXT816(0);
                  local_ca8 = ZEXT816(0);
                  local_c98 = ZEXT816(0);
                  local_c88[0] = 0;
                  local_c88[1] = 0;
                  stack0xfffffffffffff380 = 0;
                  uStack_c7b = 0;
                  iStack_c78 = 0;
                  bStack_c74 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)&old_verbosity,RVar52);
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&result_2.m_backend,
                                      (cpp_dec_float<200U,_int,_void> *)&old_verbosity);
                  bVar50 = iVar19 < 1;
                }
                local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_918.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_918.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar21,lp,iVar17,(int)local_c28,local_c54,pDVar26 + (long)pIVar27,
                           &local_800,&local_818,&local_ac8,false,bVar50,&local_918,
                           local_c60 == local_ad0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pDVar21;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar21);
                if (local_918.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_918.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (local_ac8.data != (bool *)0x0) {
                  free(local_ac8.data);
                  local_ac8.data = (bool *)0x0;
                }
                if (local_818.data != (int *)0x0) {
                  free(local_818.data);
                  local_818.data = (int *)0x0;
                }
                if (local_800.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_800.data.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_800.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_800.data.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                ::push_back(&local_9f0->data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              if (da_perm.data != (int *)0x0) {
                free(da_perm.data);
                da_perm.data = (int *)0x0;
              }
              if (((local_7b8.fpclass == cpp_dec_float_NaN) ||
                  (pnVar45 = (local_c38->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  pnVar45[iVar17].m_backend.fpclass == cpp_dec_float_NaN)) ||
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_7b8,&pnVar45[iVar17].m_backend), iVar19 < 1)) {
                bVar50 = true;
                if (((local_638.fpclass == cpp_dec_float_NaN) ||
                    (pnVar45 = (pVVar1->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                    pnVar45[iVar17].m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_638,&pnVar45[iVar17].m_backend), -1 < iVar19))
                goto LAB_00568527;
              }
              uVar10 = local_6b8._120_8_;
              bVar50 = local_6b8.neg;
              iVar18 = local_6b8.exp;
              uVar9 = local_738._120_8_;
              bVar23 = local_738.neg;
              iVar19 = local_738.exp;
              pcVar28 = &local_738;
              puVar37 = local_340;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar37 = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
              }
              pcVar28 = &local_6b8;
              puVar37 = local_3b0;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar37 = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
              }
              feastol(&local_4b0,this);
              puVar37 = local_340;
              psVar43 = (soplex *)&result_2;
              for (lVar31 = 0x1c; uVar11 = local_738._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                *(uint *)psVar43 = *puVar37;
                puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                psVar43 = psVar43 + (ulong)bVar51 * -8 + 4;
              }
              result_2.m_backend.exp = iVar19;
              result_2.m_backend.neg = bVar23;
              local_738.fpclass = (fpclass_type)uVar9;
              local_738.prec_elem = SUB84(uVar9,4);
              result_2.m_backend.fpclass = local_738.fpclass;
              result_2.m_backend.prec_elem = local_738.prec_elem;
              puVar37 = local_3b0;
              pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&perm;
              local_738._120_8_ = uVar11;
              for (lVar31 = 0x1c; uVar9 = local_6b8._120_8_, lVar31 != 0; lVar31 = lVar31 + -1) {
                (pnVar39->m_backend).data._M_elems[0] = *puVar37;
                puVar37 = puVar37 + (ulong)bVar51 * -2 + 1;
                pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
              }
              iStack_948 = iVar18;
              bStack_944 = bVar50;
              local_6b8.fpclass = (fpclass_type)uVar10;
              local_6b8.prec_elem = SUB84(uVar10,4);
              local_940._0_4_ = local_6b8.fpclass;
              local_940._4_4_ = local_6b8.prec_elem;
              local_6b8._120_8_ = uVar9;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity,(soplex *)&result_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&perm,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x0);
              pnVar39 = &local_4b0;
              pnVar44 = &factor;
              for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                (pnVar44->m_backend).data._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
                pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar39 + ((ulong)bVar51 * -2 + 1) * 4);
                pnVar44 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar44 + ((ulong)bVar51 * -2 + 1) * 4);
              }
              factor.m_backend.exp = local_4b0.m_backend.exp;
              factor.m_backend.neg = local_4b0.m_backend.neg;
              factor.m_backend.fpclass = local_4b0.m_backend.fpclass;
              factor.m_backend.prec_elem = local_4b0.m_backend.prec_elem;
              if (factor.m_backend.data._M_elems[0] != 0 ||
                  local_4b0.m_backend.fpclass != cpp_dec_float_finite) {
                factor.m_backend.neg = (bool)(local_4b0.m_backend.neg ^ 1);
              }
              if (((local_4b0.m_backend.fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_c70 == cpp_dec_float_NaN)) ||
                 (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,
                                      &factor.m_backend), 0 < iVar19)) {
                if (((local_738.fpclass != cpp_dec_float_NaN) &&
                    (local_6b8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar19 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_738,&local_6b8), iVar19 < 0)) {
                  pcVar28 = &local_6b8;
                  pcVar36 = &local_738;
                  for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                    (pcVar36->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                    pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar36 + ((ulong)bVar51 * -2 + 1) * 4);
                  }
                  local_738.exp = local_6b8.exp;
                  local_738.neg = local_6b8.neg;
                  local_738.fpclass = local_6b8.fpclass;
                  local_738.prec_elem = local_6b8.prec_elem;
                }
                pcVar28 = &local_6b8;
                pnVar45 = newLhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar17;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pnVar45->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  pnVar45 = (pointer)((long)pnVar45 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_6b8.exp;
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_6b8.neg;
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass =
                     local_6b8.fpclass;
                newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.prec_elem =
                     local_6b8.prec_elem;
                pcVar28 = &local_738;
                pnVar45 = newRhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar17;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pnVar45->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + ((ulong)bVar51 * -2 + 1) * 4);
                  pnVar45 = (pointer)((long)pnVar45 + ((ulong)bVar51 * -2 + 1) * 4);
                }
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_738.exp;
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_738.neg;
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass =
                     local_738.fpclass;
                newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.prec_elem =
                     local_738.prec_elem;
                bVar50 = true;
                bVar23 = true;
              }
              else {
                free(perm_tmp);
                perm_tmp = (int *)0x0;
                bVar23 = true;
                bVar50 = false;
              }
            }
LAB_00568527:
            if (isLhsEqualRhs.data != (bool *)0x0) {
              free(isLhsEqualRhs.data);
              isLhsEqualRhs.data = (bool *)0x0;
            }
            if (!bVar50) break;
          }
          pIVar27 = (Item *)((long)&(local_c60->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + 1);
          lVar31 = (long)(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
          local_b90 = CONCAT71(local_b90._1_7_,(long)pIVar27 < lVar31);
        } while ((long)pIVar27 < lVar31);
        bVar14 = (byte)local_b90;
      }
      RVar15 = INFEASIBLE;
      if ((bVar14 & 1) == 0) {
        if (bVar23) {
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x38])(lp,&newLhsVec,&newRhsVec,0);
        }
        uVar46 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        perm = (int *)0x0;
        spx_alloc<int*>(&perm,uVar46);
        if ((int)uVar46 < 1) {
          iVar30 = 0;
          iVar16 = 0;
        }
        else {
          pIVar27 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar6 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          uVar48 = 0;
          iVar16 = 0;
          iVar30 = 0;
          do {
            if (remRow.data[uVar48] == true) {
              perm[uVar48] = -1;
              iVar30 = iVar30 + 1;
              iVar16 = iVar16 + pIVar27[pDVar6[uVar48].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar48] = 0;
            }
            uVar48 = uVar48 + 1;
          } while (uVar46 != uVar48);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x11])(lp,perm);
        if (0 < (int)uVar46) {
          piVar47 = (this->m_rIdx).data;
          uVar48 = 0;
          do {
            if (-1 < (long)perm[uVar48]) {
              piVar47[perm[uVar48]] = piVar47[uVar48];
            }
            uVar48 = uVar48 + 1;
          } while (uVar46 != uVar48);
        }
        free(perm);
        RVar15 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar16 + iVar30 != 0 && SCARRY4(iVar16,iVar30) == iVar16 + iVar30 < 0) {
          piVar47 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remRows;
          *piVar47 = *piVar47 + iVar30;
          piVar47 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar47 = *piVar47 + iVar16;
          pSVar22 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar22 != (SPxOut *)0x0) && (3 < (int)pSVar22->m_verbosity)) {
            old_verbosity = pSVar22->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar22->_vptr_SPxOut[2])();
            pSVar22 = soplex::operator<<((this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar22->m_streams[pSVar22->m_verbosity],iVar30);
            pSVar22 = soplex::operator<<(pSVar22," rows, ");
            std::ostream::operator<<((ostream *)pSVar22->m_streams[pSVar22->m_verbosity],iVar16);
            pSVar22 = soplex::operator<<(pSVar22," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar22->m_streams[pSVar22->m_verbosity]);
            pSVar22 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar22->_vptr_SPxOut[2])(pSVar22,&old_verbosity);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 0x1c;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems[6] = 0;
          result_2.m_backend.data._M_elems[7] = 0;
          result_2.m_backend.data._M_elems[8] = 0;
          result_2.m_backend.data._M_elems[9] = 0;
          result_2.m_backend.data._M_elems[10] = 0;
          result_2.m_backend.data._M_elems[0xb] = 0;
          result_2.m_backend.data._M_elems[0xc] = 0;
          result_2.m_backend.data._M_elems[0xd] = 0;
          result_2.m_backend.data._M_elems[0xe] = 0;
          result_2.m_backend.data._M_elems[0xf] = 0;
          result_2.m_backend.data._M_elems[0x10] = 0;
          result_2.m_backend.data._M_elems[0x11] = 0;
          result_2.m_backend.data._M_elems[0x12] = 0;
          result_2.m_backend.data._M_elems[0x13] = 0;
          result_2.m_backend.data._M_elems[0x14] = 0;
          result_2.m_backend.data._M_elems[0x15] = 0;
          result_2.m_backend.data._M_elems[0x16] = 0;
          result_2.m_backend.data._M_elems[0x17] = 0;
          result_2.m_backend.data._M_elems[0x18] = 0;
          result_2.m_backend.data._M_elems[0x19] = 0;
          result_2.m_backend.data._M_elems._104_5_ = 0;
          result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,(long)iVar20,(type *)0x0);
          pnVar39 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar39) {
            pnVar44 = &result_2;
            for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
              (pnVar44->m_backend).data._M_elems[0] = (pnVar39->m_backend).data._M_elems[0];
              pnVar39 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar39 + (ulong)bVar51 * -8 + 4);
              pnVar44 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar44 + ((ulong)bVar51 * -2 + 1) * 4);
            }
            result_2.m_backend.exp =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&old_verbosity);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>
                      ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,(long)iVar30,(type *)0x0);
            iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&old_verbosity
                               );
            if (iVar20 < 0) {
              *again = true;
            }
          }
        }
      }
      if (newRhsVec.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newRhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (newLhsVec.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newLhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (remRow.data != (bool *)0x0) {
        free(remRow.data);
        remRow.data = (bool *)0x0;
      }
      if (scale.data.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar15;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}